

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

bool __thiscall
AbstractModuleClient::sendStimulationStopSlot(AbstractModuleClient *this,uint16_t slot)

{
  bool bVar1;
  TrodesMsg m;
  string local_60;
  TrodesMsg local_40;
  
  TrodesMsg::TrodesMsg(&local_40);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ss2","");
  TrodesMsg::addcontents<char_const*,char_const*,unsigned_short>
            (&local_40,&local_60,"STOP","SLOT",slot);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_40);
  TrodesMsg::~TrodesMsg(&local_40);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendStimulationStopSlot(uint16_t slot){
    TrodesMsg m;
    m.addcontents("ss2", "STOP", "SLOT", slot);
    return sendHardwareMessage(m);
}